

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf8.cxx
# Opt level: O0

int Toupper(int ucs)

{
  int iVar1;
  long lStack_18;
  int l;
  long i;
  int ucs_local;
  
  if (Toupper::table == (unsigned_short *)0x0) {
    Toupper::table = (unsigned_short *)malloc(0x20000);
    for (lStack_18 = 0; lStack_18 < 0x10000; lStack_18 = lStack_18 + 1) {
      Toupper::table[lStack_18] = (unsigned_short)lStack_18;
    }
    for (lStack_18 = 0; lStack_18 < 0x10000; lStack_18 = lStack_18 + 1) {
      iVar1 = XUtf8Tolower((int)lStack_18);
      if (iVar1 != lStack_18) {
        Toupper::table[iVar1] = (unsigned_short)lStack_18;
      }
    }
  }
  i._4_4_ = ucs;
  if ((ucs < 0x10000) && (-1 < ucs)) {
    i._4_4_ = (uint)Toupper::table[ucs];
  }
  return i._4_4_;
}

Assistant:

static int Toupper(int ucs) {
  long i;
  static unsigned short *table = NULL;

  if (!table) {
    table = (unsigned short*) malloc(
	    sizeof(unsigned short) * (NBC));
    for (i = 0; i < NBC; i++) {
      table[i] = (unsigned short) i;
    }
    for (i = 0; i < NBC; i++) {
      int l;
      l = XUtf8Tolower(i);
      if (l != i) table[l] = (unsigned short) i;
    }
  }
  if (ucs >= NBC || ucs < 0) return ucs;
  return table[ucs];
}